

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O0

IShader * __thiscall
Diligent::SerializedShaderImpl::GetDeviceShader(SerializedShaderImpl *this,RENDER_DEVICE_TYPE Type)

{
  bool bVar1;
  DeviceType DVar2;
  int iVar3;
  unique_ptr *this_00;
  pointer pCVar4;
  undefined4 extraout_var;
  IShader *local_30;
  value_type *pCompiledShader;
  DeviceType ArchiveDeviceType;
  RENDER_DEVICE_TYPE Type_local;
  SerializedShaderImpl *this_local;
  
  DVar2 = RenderDeviceTypeToArchiveDeviceType(Type);
  this_00 = (unique_ptr *)
            std::
            array<std::unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>,_7UL>
            ::operator[](&this->m_Shaders,(ulong)DVar2);
  bVar1 = std::unique_ptr::operator_cast_to_bool(this_00);
  if (bVar1) {
    pCVar4 = std::
             unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
             ::operator->((unique_ptr<Diligent::SerializedShaderImpl::CompiledShader,_std::default_delete<Diligent::SerializedShaderImpl::CompiledShader>_>
                           *)this_00);
    iVar3 = (*pCVar4->_vptr_CompiledShader[3])();
    local_30 = (IShader *)CONCAT44(extraout_var,iVar3);
  }
  else {
    local_30 = (IShader *)0x0;
  }
  return local_30;
}

Assistant:

IShader* SerializedShaderImpl::GetDeviceShader(RENDER_DEVICE_TYPE Type) const
{
    const DeviceType ArchiveDeviceType = RenderDeviceTypeToArchiveDeviceType(Type);
    const auto&      pCompiledShader   = m_Shaders[static_cast<size_t>(ArchiveDeviceType)];
    return pCompiledShader ?
        pCompiledShader->GetDeviceShader() :
        nullptr;
}